

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

float nifti_mat33_rownorm(mat33 A)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = ABS(A.m[0][2]) + ABS(A.m[0][1]) + ABS(A.m[0][0]);
  fVar3 = ABS(A.m[1][2]) + ABS(A.m[1][1]) + ABS(A.m[1][0]);
  fVar2 = ABS(A.m[2][2]) + ABS(A.m[2][1]) + ABS(A.m[2][0]);
  if (fVar3 <= fVar1) {
    fVar3 = fVar1;
  }
  if (fVar2 <= fVar3) {
    fVar2 = fVar3;
  }
  return fVar2;
}

Assistant:

float nifti_mat33_rownorm( mat33 A )  /* max row norm of 3x3 matrix */
{
   float r1,r2,r3 ;

   r1 = (float)( fabs(A.m[0][0])+fabs(A.m[0][1])+fabs(A.m[0][2]) ) ;
   r2 = (float)( fabs(A.m[1][0])+fabs(A.m[1][1])+fabs(A.m[1][2]) ) ;
   r3 = (float)( fabs(A.m[2][0])+fabs(A.m[2][1])+fabs(A.m[2][2]) ) ;
   if( r1 < r2 ) r1 = r2 ;
   if( r1 < r3 ) r1 = r3 ;
   return r1 ;
}